

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilBitMatrix.c
# Opt level: O2

int Extra_BitMatrixIsClique(Extra_BitMat_t *pMat)

{
  int iVar1;
  int iVar2;
  int k;
  int iVar3;
  int i;
  
  iVar1 = pMat->nSize;
  iVar3 = 0;
  do {
    i = iVar3;
    if (iVar1 <= i) {
      return 1;
    }
    for (k = i + 1; iVar3 = i + 1, k < iVar1; k = k + 1) {
      iVar1 = Extra_BitMatrixLookup1(pMat,i,k);
      if (iVar1 == 0) {
        iVar1 = pMat->nSize;
      }
      else {
        for (iVar3 = 0; iVar1 = pMat->nSize, iVar3 < iVar1; iVar3 = iVar3 + 1) {
          if (k != iVar3 && i != iVar3) {
            iVar1 = Extra_BitMatrixLookup1(pMat,iVar3,i);
            iVar2 = Extra_BitMatrixLookup1(pMat,iVar3,k);
            if (iVar1 != iVar2) {
              return 0;
            }
          }
        }
      }
    }
  } while( true );
}

Assistant:

int Extra_BitMatrixIsClique( Extra_BitMat_t * pMat )
{
    int v, u, i;
    for ( v = 0; v < pMat->nSize; v++ )
    for ( u = v+1; u < pMat->nSize; u++ )
    {
        if ( !Extra_BitMatrixLookup1( pMat, v, u ) )
            continue;
        // v and u are symmetric
        for ( i = 0; i < pMat->nSize; i++ )
        {
            if ( i == v || i == u )
                continue;
            // i is neither v nor u
            // the symmetry status of i is the same w.r.t. to v and u
            if ( Extra_BitMatrixLookup1( pMat, i, v ) != Extra_BitMatrixLookup1( pMat, i, u ) )
                return 0;
        }
    }
    return 1;
}